

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcParser::add_anon_obj(CTcParser *this,CTcSymObj *sym)

{
  CTcSymObjBase *in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 400) == 0) {
    *(CTcSymObjBase **)(in_RDI + 0x188) = in_RSI;
  }
  else {
    *(CTcSymObjBase **)(*(long *)(in_RDI + 400) + 8) = in_RSI;
  }
  *(CTcSymObjBase **)(in_RDI + 400) = in_RSI;
  (in_RSI->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.nxt_ =
       (CVmHashEntry *)0x0;
  CTcSymObjBase::set_anon(in_RSI,1);
  return;
}

Assistant:

void CTcParser::add_anon_obj(CTcSymObj *sym)
{
    /* link it into our list */
    if (anon_obj_tail_ != 0)
        anon_obj_tail_->nxt_ = sym;
    else
        anon_obj_head_ = sym;
    anon_obj_tail_ = sym;

    /* it's the last one */
    sym->nxt_ = 0;

    /* mark the symbol as anonymous */
    sym->set_anon(TRUE);
}